

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_Brep * ON_BrepTrimmedPlane(ON_Plane *plane,ON_SimpleArray<ON_Curve_*> *boundary,
                             bool bDuplicateCurves,ON_Brep *pBrep)

{
  ON_Interval extents;
  ON_Interval extents_00;
  ON_Interval extents_01;
  ON_Interval extents_02;
  bool bVar1;
  int si_00;
  ON_PlaneSurface *this;
  ON_BrepFace *face_00;
  ON_BrepLoop *pOVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  ON_BrepLoop *loop;
  ON_BrepFace *face;
  int si;
  ON_PlaneSurface *s;
  ON_Brep *local_30;
  ON_Brep *brep;
  ON_Brep *pBrep_local;
  bool bDuplicateCurves_local;
  ON_SimpleArray<ON_Curve_*> *boundary_local;
  ON_Plane *plane_local;
  
  if (pBrep == (ON_Brep *)0x0) {
    local_30 = (ON_Brep *)operator_new(0x138);
    ON_Brep::ON_Brep(local_30);
  }
  else {
    ON_Brep::Destroy(pBrep);
    local_30 = pBrep;
  }
  this = (ON_PlaneSurface *)operator_new(0xd0);
  ON_PlaneSurface::ON_PlaneSurface(this);
  memcpy(&this->m_plane,plane,0x80);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (0xc059000000000000,0x4059000000000000,this,0);
  dVar3 = 100.0;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (0xc059000000000000,this,1);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  extents_02.m_t[1] = dVar3;
  extents_02.m_t[0] = extraout_XMM0_Qa;
  ON_PlaneSurface::SetExtents(this,0,extents_02,false);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
  extents_01.m_t[1] = dVar3;
  extents_01.m_t[0] = extraout_XMM0_Qa_00;
  ON_PlaneSurface::SetExtents(this,1,extents_01,false);
  si_00 = ON_Brep::AddSurface(local_30,(ON_Surface *)this);
  face_00 = ON_Brep::NewFace(local_30,si_00);
  (*(face_00->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
    _vptr_ON_Object[0x17])(face_00,1);
  bVar1 = ON_Brep::NewPlanarFaceLoop(local_30,face_00->m_face_index,outer,boundary,bDuplicateCurves)
  ;
  if (bVar1) {
    pOVar2 = ON_ClassArray<ON_BrepLoop>::Last((ON_ClassArray<ON_BrepLoop> *)&local_30->m_L);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              ((pOVar2->m_pbox).m_min.x,(pOVar2->m_pbox).m_max.x,this,0);
    dVar3 = (pOVar2->m_pbox).m_max.y;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              ((pOVar2->m_pbox).m_min.y,this,1);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    extents_00.m_t[1] = dVar3;
    extents_00.m_t[0] = extraout_XMM0_Qa_01;
    ON_PlaneSurface::SetExtents(this,0,extents_00,false);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
    extents.m_t[1] = dVar3;
    extents.m_t[0] = extraout_XMM0_Qa_02;
    ON_PlaneSurface::SetExtents(this,1,extents,false);
    ON_Brep::SetTrimIsoFlags(local_30,face_00);
  }
  else {
    if (pBrep == (ON_Brep *)0x0) {
      if (local_30 != (ON_Brep *)0x0) {
        (*(local_30->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
    }
    else {
      ON_Brep::Destroy(pBrep);
    }
    local_30 = (ON_Brep *)0x0;
  }
  return local_30;
}

Assistant:

ON_Brep* ON_BrepTrimmedPlane( 
            const ON_Plane& plane, 
            ON_SimpleArray<ON_Curve*>& boundary,
            bool bDuplicateCurves,
            ON_Brep* pBrep )
{
  ON_Brep* brep;
  if ( pBrep )
  {
    pBrep->Destroy();
    brep = pBrep;
  }
  else
    brep = new ON_Brep();

  ON_PlaneSurface* s = new ON_PlaneSurface();
  s->m_plane = plane;
  s->SetDomain(0, -100.0, 100.0 ); // any domain and extents will do for now
  s->SetDomain(1, -100.0, 100.0 );
  s->SetExtents(0, s->Domain(0) );
  s->SetExtents(1, s->Domain(1) );
  const int si = brep->AddSurface(s);
  ON_BrepFace& face = brep->NewFace( si );
  face.DestroyRuntimeCache();
  if ( brep->NewPlanarFaceLoop( face.m_face_index, ON_BrepLoop::outer, boundary, bDuplicateCurves ) )
  {
    // set face domain
    const ON_BrepLoop* loop = brep->m_L.Last();
    s->SetDomain(0, loop->m_pbox.m_min.x, loop->m_pbox.m_max.x );
    s->SetDomain(1, loop->m_pbox.m_min.y, loop->m_pbox.m_max.y );
    s->SetExtents(0,s->Domain(0));
    s->SetExtents(1,s->Domain(1));

    // need to update trim m_iso flags because we changed surface shape
    brep->SetTrimIsoFlags(face);
  }
  else
  {
    if ( pBrep )
      pBrep->Destroy();
    else
      delete brep;
    brep = nullptr;
  }
  return brep;
}